

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O1

void __thiscall
defyx::SuperscalarInstructionInfo::SuperscalarInstructionInfo<2ul>
          (SuperscalarInstructionInfo *this,char *name,SuperscalarInstructionType type,
          MacroOp (*arr) [2],int resultOp,int dstOp,int srcOp)

{
  pointer *ppMVar1;
  undefined8 *puVar2;
  iterator __position;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  MacroOp MStack_48;
  
  this->name_ = name;
  this->type_ = type;
  (this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  this->resultOp_ = resultOp;
  this->dstOp_ = dstOp;
  this->srcOp_ = srcOp;
  lVar5 = 0;
  do {
    puVar2 = (undefined8 *)((long)&(*arr)[0].name_ + lVar5);
    MStack_48.name_ = (char *)*puVar2;
    uVar3 = puVar2[1];
    puVar2 = (undefined8 *)((long)&(*arr)[0].size_ + lVar5 + 1);
    uVar4 = puVar2[1];
    MStack_48.uop1_._0_1_ = (undefined1)((ulong)*puVar2 >> 0x38);
    MStack_48._17_7_ = SUB87(uVar4,0);
    MStack_48.dependent_ = SUB81((ulong)uVar4 >> 0x38,0);
    MStack_48.size_._0_1_ = (undefined1)uVar3;
    MStack_48._9_7_ = SUB87((ulong)uVar3 >> 8,0);
    __position._M_current =
         (this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>::
      _M_realloc_insert<defyx::MacroOp>(&this->ops_,__position,&MStack_48);
    }
    else {
      (__position._M_current)->uop1_ = (int)CONCAT71(MStack_48._17_7_,(undefined1)MStack_48.uop1_);
      (__position._M_current)->uop2_ = MStack_48.uop2_;
      *(ulong *)&(__position._M_current)->dependent_ =
           CONCAT71(MStack_48._25_7_,MStack_48.dependent_);
      (__position._M_current)->name_ = MStack_48.name_;
      (__position._M_current)->size_ = (int)uVar3;
      (__position._M_current)->latency_ = (int)((ulong)uVar3 >> 0x20);
      ppMVar1 = &(this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppMVar1 = *ppMVar1 + 1;
    }
    this->latency_ =
         this->latency_ +
         (this->ops_).super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].latency_;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 == 0x20);
  return;
}

Assistant:

SuperscalarInstructionInfo(const char* name, SuperscalarInstructionType type, const MacroOp(&arr)[N], int resultOp, int dstOp, int srcOp)
			: name_(name), type_(type), latency_(0), resultOp_(resultOp), dstOp_(dstOp), srcOp_(srcOp) {
			for (unsigned i = 0; i < N; ++i) {
				ops_.push_back(MacroOp(arr[i]));
				latency_ += ops_.back().getLatency();
			}
			static_assert(N > 1, "Invalid array size");
		}